

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O1

void test_ru_maximal_simplex_removal<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,false>>>
               (void)

{
  pointer puVar1;
  pointer pvVar2;
  undefined4 local_238;
  int local_234;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  int *local_218;
  undefined1 *local_210;
  undefined1 local_208;
  undefined8 local_200;
  shared_count sStack_1f8;
  undefined **local_1f0;
  undefined1 local_1e8;
  undefined8 *local_1e0;
  undefined1 **local_1d8;
  undefined **local_1d0;
  undefined1 local_1c8;
  undefined8 *local_1c0;
  int **local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  undefined **local_180;
  undefined1 local_178;
  undefined8 *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>
  m;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,false>>>>
            ();
  m.colSettings_ = (Column_settings *)operator_new(0x38);
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x18;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,false>>>
  ::RU_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,false>>>
              *)&m.matrix_,&columns,m.colSettings_);
  puVar1 = columns.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[5].
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (columns.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[5].
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    columns.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[5].
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puVar1;
  }
  test_content_equality<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,false>>>
            (&columns,&m);
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_148 = "";
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_150,0x36f);
  local_178 = 0;
  local_180 = &PTR__lazy_ostream_001d90e8;
  local_170 = &boost::unit_test::lazy_ostream::inst;
  local_168 = "";
  local_218 = &local_234;
  local_234 = (int)m.matrix_.reducedMatrixR_.matrix_._M_h._M_element_count;
  local_238 = 7;
  local_208 = (int)m.matrix_.reducedMatrixR_.matrix_._M_h._M_element_count == 7;
  local_200 = 0;
  sStack_1f8.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1a8 = "";
  local_1b8 = &local_218;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_001d9030;
  local_1c0 = &boost::unit_test::lazy_ostream::inst;
  local_1e8 = 0;
  local_1f0 = &PTR__lazy_ostream_001d90a8;
  local_1e0 = &boost::unit_test::lazy_ostream::inst;
  local_210 = (undefined1 *)&local_238;
  local_1d8 = &local_210;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1f8);
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>
  ::remove_last(&m.matrix_);
  puVar1 = columns.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pvVar2 = columns.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
  if (puVar1 != (pointer)0x0) {
    pvVar2 = columns.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    columns.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         columns.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    operator_delete(puVar1,(long)(pvVar2->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
    pvVar2 = columns.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  columns.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar2;
  test_content_equality<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,false>>>
            (&columns,&m);
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_190,0x37c);
  local_178 = 0;
  local_180 = &PTR__lazy_ostream_001d90e8;
  local_170 = &boost::unit_test::lazy_ostream::inst;
  local_168 = "";
  local_234 = (int)m.matrix_.reducedMatrixR_.matrix_._M_h._M_element_count;
  local_208 = (int)m.matrix_.reducedMatrixR_.matrix_._M_h._M_element_count == 6;
  local_238 = 6;
  local_200 = 0;
  sStack_1f8.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1a8 = "";
  local_218 = &local_234;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_001d9030;
  local_1c0 = &boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_218;
  local_1e8 = 0;
  local_1f0 = &PTR__lazy_ostream_001d90a8;
  local_1e0 = &boost::unit_test::lazy_ostream::inst;
  local_210 = (undefined1 *)&local_238;
  local_1d8 = &local_210;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1f8);
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>
  ::~Matrix(&m);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&columns);
  return;
}

Assistant:

void test_ru_maximal_simplex_removal() {
  auto columns = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  columns[5].clear();

  test_content_equality(columns, m);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 7);
  if constexpr (Matrix::Option_list::has_column_pairings) {
    BOOST_CHECK_EQUAL(m.get_current_barcode().back().death, 6);
  }

  if constexpr (Matrix::Option_list::has_vine_update) {
    m.remove_maximal_cell(6);
  } else {
    m.remove_last();
  }

  columns.pop_back();
  test_content_equality(columns, m);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 6);
  if constexpr (Matrix::Option_list::has_column_pairings) {
    BOOST_CHECK_EQUAL(m.get_current_barcode().back().death,
                      Matrix::template get_null_value<typename Matrix::ID_index>());
  }
}